

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

char goodform::json::parse_escaped_char(char input)

{
  byte bVar1;
  
  bVar1 = (byte)(input + 0x9eU) >> 1 | input * -0x80;
  if ((bVar1 < 10) && ((0x345U >> (bVar1 & 0x1f) & 1) != 0)) {
    input = (&DAT_001337a4)[bVar1];
  }
  return input;
}

Assistant:

char json::parse_escaped_char(char input)
  {
    char returnVal = -1;
    if (input == '\\')
      returnVal = input;
    else if (input == '/')
      returnVal = input;
    else if (input == '"')
      returnVal = input;
    else if (input == 'b')
      returnVal = '\b';
    else if (input == 'f')
      returnVal = '\f';
    else if (input == 'n')
      returnVal = '\n';
    else if (input == 'r')
      returnVal = '\r';
    else if (input == 't')
      returnVal = '\t';
    else
      returnVal = input;
    return returnVal;
  }